

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

void __thiscall
CVmObjVector::restore_from_file(CVmObjVector *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  ulong uVar1;
  ulong in_RAX;
  uint16_t tmp;
  char b [2];
  char b_1 [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  CVmFile::read_bytes(fp,(char *)((long)&uStack_38 + 4),2);
  uVar1 = uStack_38 >> 0x20;
  CVmFile::read_bytes(fp,(char *)((long)&uStack_38 + 6),2);
  if ((this->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)0x0;
  }
  alloc_vector(this,uVar1 & 0xffff);
  *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) = uStack_38._6_2_;
  CVmFile::read_bytes(fp,(this->super_CVmObjCollection).super_CVmObject.ext_ + 4,
                      (ulong)uStack_38._6_2_ * 5);
  CVmObjFixup::fix_dh_array
            (fixups,(this->super_CVmObjCollection).super_CVmObject.ext_ + 4,(ulong)uStack_38._6_2_);
  return;
}

Assistant:

void CVmObjVector::restore_from_file(VMG_ vm_obj_id_t self,
                                     CVmFile *fp, CVmObjFixup *fixups)
{
    size_t ele_cnt;
    size_t alloc_cnt;

    /* read the element count and the full allocation count */
    alloc_cnt = fp->read_uint2();
    ele_cnt = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space at the allocation count */
    alloc_vector(vmg_ alloc_cnt);

    /* set the actual in-use element count */
    set_element_count(ele_cnt);

    /* read the contents */
    fp->read_bytes(get_element_ptr(0), calc_alloc_ele(ele_cnt));

    /* fix up object references in the values */
    fixups->fix_dh_array(vmg_ get_element_ptr(0), ele_cnt);
}